

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O3

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<float,_float>,_Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,_-1,_-1,_false>_>,_4,_0>
       ::run(redux_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>_>
             *mat,scalar_sum_op<float,_float> *func)

{
  float *pfVar1;
  ulong uVar2;
  PointerType ptr;
  PointerType pfVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  PointerType pfVar7;
  ulong uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  uVar2 = (mat->m_xpr->
          super_BlockImpl<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false,_Eigen::Dense>).
          super_BlockImpl_dense<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false,_true>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>,_1>.
          super_MapBase<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>,_0>.
          m_rows.m_value;
  if ((0 < (long)uVar2) &&
     (lVar4 = (mat->m_xpr->
              super_BlockImpl<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false,_Eigen::Dense>)
              .super_BlockImpl_dense<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false,_true>.
              super_MapBase<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>,_1>
              .
              super_MapBase<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>,_0>
              .m_cols.m_value, 0 < lVar4)) {
    pfVar3 = (mat->m_evaluator).
             super_block_evaluator<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false,_true>.
             super_mapbase_evaluator<Eigen::Block<Eigen::Matrix<float,_48,_24,_0,_48,_24>,__1,__1,_false>,_Eigen::Matrix<float,__1,__1,_0,_48,_24>_>
             .m_data;
    if (uVar2 < 4) {
      fVar9 = *pfVar3;
      if (uVar2 != 1) {
        uVar5 = 1;
        do {
          fVar9 = fVar9 + pfVar3[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar2 != uVar5);
      }
      if (lVar4 != 1) {
        lVar6 = 2;
        if (2 < lVar4) {
          lVar6 = lVar4;
        }
        lVar4 = 1;
        do {
          pfVar3 = pfVar3 + 0x30;
          uVar5 = 0;
          do {
            fVar9 = fVar9 + pfVar3[uVar5];
            uVar5 = uVar5 + 1;
          } while (uVar2 != uVar5);
          lVar4 = lVar4 + 1;
        } while (lVar4 != lVar6);
      }
    }
    else {
      uVar5 = uVar2 & 0x7ffffffffffffffc;
      fVar9 = *pfVar3;
      fVar10 = pfVar3[1];
      fVar11 = pfVar3[2];
      fVar12 = pfVar3[3];
      lVar6 = 0;
      pfVar7 = pfVar3;
      do {
        for (uVar8 = (ulong)(lVar6 == 0) << 2; uVar8 < uVar5; uVar8 = uVar8 + 4) {
          pfVar1 = pfVar7 + uVar8;
          fVar9 = fVar9 + *pfVar1;
          fVar10 = fVar10 + pfVar1[1];
          fVar11 = fVar11 + pfVar1[2];
          fVar12 = fVar12 + pfVar1[3];
        }
        lVar6 = lVar6 + 1;
        pfVar7 = pfVar7 + 0x30;
      } while (lVar6 != lVar4);
      fVar9 = fVar12 + fVar10 + fVar11 + fVar9;
      lVar6 = 0;
      uVar8 = uVar5;
      do {
        for (; (long)uVar8 < (long)uVar2; uVar8 = uVar8 + 1) {
          fVar9 = fVar9 + pfVar3[uVar8];
        }
        lVar6 = lVar6 + 1;
        pfVar3 = pfVar3 + 0x30;
        uVar8 = uVar5;
      } while (lVar6 != lVar4);
    }
    return fVar9;
  }
  __assert_fail("mat.rows()>0 && mat.cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/luojunhui1[P]ImageOnC/include/Eigen/src/Core/Redux.h"
                ,0x114,
                "static Scalar Eigen::internal::redux_impl<Eigen::internal::scalar_sum_op<float>, Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<float, 48, 24>>>>::run(const Derived &, const Func &) [Func = Eigen::internal::scalar_sum_op<float>, Derived = Eigen::internal::redux_evaluator<Eigen::Block<Eigen::Matrix<float, 48, 24>>>, Traversal = 4, Unrolling = 0]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC static Scalar run(const Derived &mat, const Func& func)
  {
    eigen_assert(mat.rows()>0 && mat.cols()>0 && "you are using an empty matrix");
    const Index innerSize = mat.innerSize();
    const Index outerSize = mat.outerSize();
    enum {
      packetSize = redux_traits<Func, Derived>::PacketSize
    };
    const Index packetedInnerSize = ((innerSize)/packetSize)*packetSize;
    Scalar res;
    if(packetedInnerSize)
    {
      PacketType packet_res = mat.template packet<Unaligned,PacketType>(0,0);
      for(Index j=0; j<outerSize; ++j)
        for(Index i=(j==0?packetSize:0); i<packetedInnerSize; i+=Index(packetSize))
          packet_res = func.packetOp(packet_res, mat.template packetByOuterInner<Unaligned,PacketType>(j,i));

      res = func.predux(packet_res);
      for(Index j=0; j<outerSize; ++j)
        for(Index i=packetedInnerSize; i<innerSize; ++i)
          res = func(res, mat.coeffByOuterInner(j,i));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = redux_impl<Func, Derived, DefaultTraversal, NoUnrolling>::run(mat, func);
    }

    return res;
  }